

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_dictionary.hpp
# Opt level: O2

unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>,_true> __thiscall
duckdb::PrimitiveDictionary<long,_long,_duckdb::ParquetTimestampNSOperator>::GetTargetMemoryStream
          (PrimitiveDictionary<long,_long,_duckdb::ParquetTimestampNSOperator> *this)

{
  pointer pMVar1;
  unsigned_long local_28;
  uchar *local_20;
  
  local_20 = (uchar *)duckdb::MemoryStream::GetData();
  local_28 = duckdb::MemoryStream::GetCapacity();
  make_uniq<duckdb::MemoryStream,unsigned_char*,unsigned_long>((duckdb *)this,&local_20,&local_28);
  pMVar1 = unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>,_true>::
           operator->((unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>,_true>
                       *)this);
  duckdb::MemoryStream::GetPosition();
  duckdb::MemoryStream::SetPosition((ulong)pMVar1);
  return (unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>_>)
         (unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>_>)this;
}

Assistant:

unique_ptr<MemoryStream> GetTargetMemoryStream() const {
		auto result = make_uniq<MemoryStream>(target_stream.GetData(), target_stream.GetCapacity());
		result->SetPosition(target_stream.GetPosition());
		return result;
	}